

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_distinct_aggregator.cpp
# Opt level: O2

void __thiscall
duckdb::WindowDistinctAggregatorLocalState::FlushStates(WindowDistinctAggregatorLocalState *this)

{
  WindowDistinctAggregatorGlobalState *pWVar1;
  AggregateInputData aggr_input_data;
  AggregateInputData local_38;
  
  if (this->flush_count != 0) {
    pWVar1 = this->gastate;
    local_38.bind_data.ptr =
         AggregateObject::GetFunctionData(&(pWVar1->super_WindowAggregatorGlobalState).aggr);
    local_38.allocator =
         &(this->super_WindowAggregatorLocalState).super_WindowAggregatorState.allocator;
    local_38.combine_type = PRESERVE_INPUT;
    Vector::Verify(&this->statel,this->flush_count);
    (*(pWVar1->super_WindowAggregatorGlobalState).aggr.function.combine)
              (&this->statel,&this->statep,&local_38,this->flush_count);
    this->flush_count = 0;
  }
  return;
}

Assistant:

void WindowDistinctAggregatorLocalState::FlushStates() {
	if (!flush_count) {
		return;
	}

	const auto &aggr = gastate.aggr;
	AggregateInputData aggr_input_data(aggr.GetFunctionData(), allocator);
	statel.Verify(flush_count);
	aggr.function.combine(statel, statep, aggr_input_data, flush_count);

	flush_count = 0;
}